

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdOpts.cpp
# Opt level: O0

int __thiscall CmdOpts::find(CmdOpts *this,char letter)

{
  int local_18;
  int optIdx;
  char letter_local;
  CmdOpts *this_local;
  
  local_18 = 0;
  while ((local_18 < this->_numOpts && (this->_opts[local_18].letter != letter))) {
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

int
CmdOpts::find(char letter)
{
    int optIdx;

    for (optIdx = 0; optIdx < _numOpts; optIdx++)
        if (_opts[optIdx].letter == letter)
            break;

    return optIdx;
}